

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmdisubwindow.cpp
# Opt level: O2

void __thiscall QMdiSubWindowPrivate::_q_enterInteractiveMode(QMdiSubWindowPrivate *this)

{
  QWidget *this_00;
  long lVar1;
  QWidgetData *pQVar2;
  Representation RVar3;
  Representation RVar4;
  Representation RVar5;
  bool bVar6;
  int iVar7;
  uint uVar8;
  QObject *object;
  QAction *pQVar9;
  QAction *pQVar10;
  QStyle *pQVar11;
  QPoint QVar12;
  byte bVar13;
  ulong uVar14;
  long in_FS_OFFSET;
  QPoint local_48 [2];
  QPoint local_38;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QWidget **)&(this->super_QWidgetPrivate).field_0x8;
  object = (QObject *)QObject::sender();
  pQVar9 = QtPrivate::qobject_cast_helper<QAction*,QObject>(object);
  if (pQVar9 == (QAction *)0x0) goto LAB_00416b24;
  local_38.xp.m_i = 0;
  local_38.yp.m_i = 0;
  bVar6 = QPointer::operator_cast_to_bool((QPointer *)(this->actions + 1));
  if (bVar6) {
    lVar1 = *(long *)(this->actions + 1);
    if ((lVar1 == 0) || (*(int *)(lVar1 + 4) == 0)) {
      pQVar10 = (QAction *)0x0;
    }
    else {
      pQVar10 = (QAction *)this->actions[1].wp.value;
    }
    if (pQVar10 != pQVar9) goto LAB_0041699a;
    this->currentOperation = Move;
    uVar14 = (long)(((this_00->data->crect).x2.m_i - (this_00->data->crect).x1.m_i) + 1) / 2 &
             0xffffffff;
    iVar7 = titleBarHeight(this);
    uVar8 = iVar7 - 1;
  }
  else {
LAB_0041699a:
    bVar6 = QPointer::operator_cast_to_bool((QPointer *)(this->actions + 2));
    if (!bVar6) goto LAB_00416b24;
    lVar1 = *(long *)(this->actions + 2);
    if ((lVar1 == 0) || (*(int *)(lVar1 + 4) == 0)) {
      pQVar10 = (QAction *)0x0;
    }
    else {
      pQVar10 = (QAction *)this->actions[2].wp.value;
    }
    if (pQVar10 != pQVar9) goto LAB_00416b24;
    bVar6 = QWidget::isLeftToRight(this_00);
    this->currentOperation = bVar6 | BottomLeftResize;
    pQVar11 = QWidget::style(this_00);
    iVar7 = (**(code **)(*(long *)pQVar11 + 0xe0))(pQVar11,0x2c,0,this_00);
    uVar14 = (long)iVar7 / 2 & 0xffffffff;
    bVar6 = QWidget::isLeftToRight(this_00);
    pQVar2 = this_00->data;
    iVar7 = (int)((long)iVar7 / 2);
    if (bVar6) {
      uVar14 = (ulong)(((pQVar2->crect).x2.m_i - ((pQVar2->crect).x1.m_i + iVar7)) + 1);
    }
    uVar8 = ((pQVar2->crect).y2.m_i - (iVar7 + (pQVar2->crect).y1.m_i)) + 1;
  }
  local_38 = (QPoint)(uVar14 | (ulong)uVar8 << 0x20);
  updateCursor(this);
  QWidget::cursor((QWidget *)(local_48 + 1));
  local_48[0] = QWidget::mapToGlobal(this_00,&local_38);
  QCursor::setPos(local_48);
  QCursor::~QCursor((QCursor *)(local_48 + 1));
  QVar12 = QWidget::mapToParent(this_00,&local_38);
  this->mousePressPosition = QVar12;
  pQVar2 = this_00->data;
  RVar3.m_i = (pQVar2->crect).y1.m_i;
  RVar4.m_i = (pQVar2->crect).x2.m_i;
  RVar5.m_i = (pQVar2->crect).y2.m_i;
  (this->oldGeometry).x1 = (Representation)(pQVar2->crect).x1.m_i;
  (this->oldGeometry).y1 = (Representation)RVar3.m_i;
  (this->oldGeometry).x2 = (Representation)RVar4.m_i;
  (this->oldGeometry).y2 = (Representation)RVar5.m_i;
  this->isInInteractiveMode = true;
  QWidget::setFocus(this_00);
  bVar13 = (byte)*(undefined4 *)(*(long *)&this_00->field_0x8 + 0x388);
  if (((bVar13 >> 2 & (this->currentOperation & ~Move) == BottomLeftResize) == 0) &&
     ((this->currentOperation == Move & bVar13 >> 3) != 1)) {
    QWidget::grabMouse(this_00);
  }
  else {
    enterRubberBandMode(this);
  }
LAB_00416b24:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QMdiSubWindowPrivate::_q_enterInteractiveMode()
{
#ifndef QT_NO_ACTION
    Q_Q(QMdiSubWindow);
    QAction *action = qobject_cast<QAction *>(q->sender());
    if (!action)
        return;

    QPoint pressPos;
    if (actions[MoveAction] && actions[MoveAction] == action) {
        currentOperation = Move;
        pressPos = QPoint(q->width() / 2, titleBarHeight() - 1);
    } else if (actions[ResizeAction] && actions[ResizeAction] == action) {
        currentOperation = q->isLeftToRight() ? BottomRightResize : BottomLeftResize;
        int offset = q->style()->pixelMetric(QStyle::PM_MdiSubWindowFrameWidth, nullptr, q) / 2;
        int x = q->isLeftToRight() ? q->width() - offset : offset;
        pressPos = QPoint(x, q->height() - offset);
    } else {
        return;
    }

    updateCursor();
#ifndef QT_NO_CURSOR
    q->cursor().setPos(q->mapToGlobal(pressPos));
#endif
    mousePressPosition = q->mapToParent(pressPos);
    oldGeometry = q->geometry();
    isInInteractiveMode = true;
    q->setFocus();
#if QT_CONFIG(rubberband)
    if ((q->testOption(QMdiSubWindow::RubberBandResize)
            && (currentOperation == BottomRightResize || currentOperation == BottomLeftResize))
            || (q->testOption(QMdiSubWindow::RubberBandMove) && currentOperation == Move)) {
        enterRubberBandMode();
    } else
#endif // QT_CONFIG(rubberband)
    {
        q->grabMouse();
    }
#endif // QT_NO_ACTION
}